

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ParserReset(Parse *pParse)

{
  sqlite3 *db;
  
  db = pParse->db;
  if (pParse->aLabel != (int *)0x0) {
    sqlite3DbFreeNN(db,pParse->aLabel);
  }
  if (pParse->pConstExpr != (ExprList *)0x0) {
    exprListDeleteNN(db,pParse->pConstExpr);
  }
  if (db != (sqlite3 *)0x0) {
    (db->lookaside).bDisable = (db->lookaside).bDisable - (uint)pParse->disableLookaside;
  }
  pParse->disableLookaside = '\0';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ParserReset(Parse *pParse){
  sqlite3 *db = pParse->db;
  sqlite3DbFree(db, pParse->aLabel);
  sqlite3ExprListDelete(db, pParse->pConstExpr);
  if( db ){
    assert( db->lookaside.bDisable >= pParse->disableLookaside );
    db->lookaside.bDisable -= pParse->disableLookaside;
  }
  pParse->disableLookaside = 0;
}